

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Sequence.cpp
# Opt level: O2

void __thiscall chrono::ChFseqNode::ChFseqNode(ChFseqNode *this,ChFseqNode *other)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  (this->fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> *)other);
  dVar1 = other->weight;
  dVar2 = other->t_start;
  dVar3 = other->t_end;
  this->duration = other->duration;
  this->weight = dVar1;
  this->t_start = dVar2;
  this->t_end = dVar3;
  dVar1 = other->Iydt;
  this->Iy = other->Iy;
  this->Iydt = dVar1;
  this->Iydtdt = other->Iydtdt;
  this->y_cont = other->y_cont;
  this->ydt_cont = other->ydt_cont;
  this->ydtdt_cont = other->ydtdt_cont;
  return;
}

Assistant:

ChFseqNode::ChFseqNode(const ChFseqNode& other) {
    fx = other.fx;
    duration = other.duration;
    weight = other.weight;
    t_start = other.t_start;
    t_end = other.t_end;
    Iy = other.Iy;
    Iydt = other.Iydt;
    Iydtdt = other.Iydtdt;
    y_cont = other.y_cont;
    ydt_cont = other.ydt_cont;
    ydtdt_cont = other.ydtdt_cont;
}